

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyDistributionEdgeCalculator.cpp
# Opt level: O0

double __thiscall
AnyDistributionEdgeCalculator::insertSizeSumRightTail(AnyDistributionEdgeCalculator *this,int k)

{
  size_type sVar1;
  reference pvVar2;
  int iVar3;
  int in_ESI;
  vector<double,_std::allocator<double>_> *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  value_type local_8;
  
  if (in_ESI < *(int *)&in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start) {
    local_8 = 1.0;
  }
  else {
    iVar3 = in_ESI - *(int *)&in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start;
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)
                       in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (iVar3 < (int)sVar1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (in_RDI,CONCAT44(iVar3,in_stack_ffffffffffffffd8));
      local_8 = *pvVar2;
    }
    else {
      local_8 = 0.0;
    }
  }
  return local_8;
}

Assistant:

double AnyDistributionEdgeCalculator::insertSizeSumRightTail(int k) const {
	if (k<insert_size_sum_ccdf_offset) return 1.0;
	int i = k - insert_size_sum_ccdf_offset;
	if (i < (int)insert_size_sum_ccdf->size()) {
		return insert_size_sum_ccdf->at(i);
	} else {
		return 0.0;
	}
}